

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.hpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
boost::unit_test::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *os,basic_cstring<const_char> *str)

{
  char *pcVar1;
  ostream *poVar2;
  ulong uVar3;
  basic_cstring<const_char> *in_RSI;
  ostream *in_RDI;
  char *end;
  char *beg;
  allocator local_41;
  string local_40 [32];
  const_iterator local_20;
  char *local_18;
  basic_cstring<const_char> *local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = basic_cstring<const_char>::begin(in_RSI);
  local_20 = basic_cstring<const_char>::end(local_10);
  poVar2 = local_8;
  pcVar1 = local_18;
  uVar3 = (long)local_20 - (long)local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,pcVar1,uVar3,&local_41);
  std::operator<<(poVar2,local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return local_8;
}

Assistant:

inline std::basic_ostream<CharT1,Tr>&
operator<<( std::basic_ostream<CharT1,Tr>& os, basic_cstring<CharT2> const& str )
{
    CharT1 const* const beg = reinterpret_cast<CharT1 const*>( str.begin() ); // !!
    CharT1 const* const end = reinterpret_cast<CharT1 const*>( str.end() );
    os << std::basic_string<CharT1,Tr>( beg, end - beg );

    return os;
}